

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Bech32.cpp
# Opt level: O0

void __thiscall
Bech32Test_extractDataPart_Test::~Bech32Test_extractDataPart_Test
          (Bech32Test_extractDataPart_Test *this)

{
  Bech32Test_extractDataPart_Test *this_local;
  
  ~Bech32Test_extractDataPart_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Bech32Test, extractDataPart) {
    std::string str("ab1cd");
    std::vector<unsigned char> dp = extractDataPart(str);
    ASSERT_EQ(dp[0], 'c');
    ASSERT_EQ(dp.size(), 2);

    str = "ab1";
    dp = extractDataPart(str);
    ASSERT_TRUE(dp.empty());

    str = "1cd";
    dp = extractDataPart(str);
    ASSERT_EQ(dp.size(), 2);
    ASSERT_EQ(dp[0], 'c');
    ASSERT_EQ(dp[1], 'd');

    str = "1";
    dp = extractDataPart(str);
    ASSERT_TRUE(dp.empty());
}